

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureMultisampleTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::SamplePosRasterizationTest::iterate
          (SamplePosRasterizationTest *this)

{
  size_type *psVar1;
  float *pfVar2;
  undefined8 uVar3;
  TestLog *log;
  RenderContext *context;
  TestContext *this_00;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  long *plVar7;
  undefined8 *puVar8;
  undefined4 extraout_var;
  pointer pTVar9;
  RenderTarget *pRVar10;
  long *plVar11;
  ulong *puVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  IterateResult IVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  ScopedLogSection section;
  TriangleSceneSpec scene;
  Surface glSurface;
  SceneTriangle triangle;
  string local_340;
  string local_320;
  ulong *local_300;
  long local_2f8;
  ulong local_2f0;
  long lStack_2e8;
  ulong *local_2e0;
  long local_2d8;
  ulong local_2d0;
  long lStack_2c8;
  ScopedLogSection local_2c0;
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  local_2b8;
  Surface local_2a0;
  ulong *local_288;
  long local_280;
  ulong local_278 [2];
  ulong *local_268;
  long local_260;
  ulong local_258 [2];
  undefined8 local_248;
  float fStack_240;
  float fStack_23c;
  long *local_238;
  long local_230;
  long local_228;
  long lStack_220;
  long *local_218;
  long local_210;
  long local_208;
  long lStack_200;
  long *local_1f8 [2];
  long local_1e8 [2];
  long *local_1d8 [2];
  long local_1c8 [2];
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188 [12];
  bool local_158 [16];
  ios_base local_148 [8];
  ios_base local_140 [272];
  
  iVar5 = this->m_iteration;
  tcu::Surface::Surface(&local_2a0,this->m_canvasSize,this->m_canvasSize);
  local_2b8.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b8.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (Functional::(anonymous_namespace)::SamplePosRasterizationTest::drawSample(tcu::Surface&,int)::
      fullscreenQuad == '\0') {
    _GLOBAL__N_1::SamplePosRasterizationTest::iterate();
  }
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
  iVar13 = iVar5 + 1;
  std::ostream::operator<<(local_1b8,iVar13);
  std::__cxx11::stringbuf::str();
  local_248 = (long)iVar5;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  std::ios_base::~ios_base(local_148);
  plVar7 = (long *)std::__cxx11::string::replace((ulong)local_1d8,0,(char *)0x0,0x1c61790);
  plVar11 = plVar7 + 2;
  if ((long *)*plVar7 == plVar11) {
    local_208 = *plVar11;
    lStack_200 = plVar7[3];
    local_218 = &local_208;
  }
  else {
    local_208 = *plVar11;
    local_218 = (long *)*plVar7;
  }
  local_210 = plVar7[1];
  *plVar7 = (long)plVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_218);
  puVar12 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar12) {
    local_2d0 = *puVar12;
    lStack_2c8 = plVar7[3];
    local_2e0 = &local_2d0;
  }
  else {
    local_2d0 = *puVar12;
    local_2e0 = (ulong *)*plVar7;
  }
  local_2d8 = plVar7[1];
  *plVar7 = (long)puVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
  std::ostream::operator<<(local_1b8,this->m_samples);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  std::ios_base::~ios_base(local_148);
  uVar14 = 0xf;
  if (local_2e0 != &local_2d0) {
    uVar14 = local_2d0;
  }
  if (uVar14 < (ulong)(local_260 + local_2d8)) {
    uVar14 = 0xf;
    if (local_268 != local_258) {
      uVar14 = local_258[0];
    }
    if (uVar14 < (ulong)(local_260 + local_2d8)) goto LAB_01518b7b;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_268,0,(char *)0x0,(ulong)local_2e0);
  }
  else {
LAB_01518b7b:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)local_268);
  }
  local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
  psVar1 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_340.field_2._M_allocated_capacity = *psVar1;
    local_340.field_2._8_8_ = puVar8[3];
  }
  else {
    local_340.field_2._M_allocated_capacity = *psVar1;
    local_340._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_340._M_string_length = puVar8[1];
  *puVar8 = psVar1;
  puVar8[1] = 0;
  *(undefined1 *)psVar1 = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
  std::ostream::operator<<(local_1b8,iVar13);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  std::ios_base::~ios_base(local_148);
  plVar7 = (long *)std::__cxx11::string::replace((ulong)local_1f8,0,(char *)0x0,0x1c61790);
  plVar11 = plVar7 + 2;
  if ((long *)*plVar7 == plVar11) {
    local_228 = *plVar11;
    lStack_220 = plVar7[3];
    local_238 = &local_228;
  }
  else {
    local_228 = *plVar11;
    local_238 = (long *)*plVar7;
  }
  local_230 = plVar7[1];
  *plVar7 = (long)plVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_238);
  puVar12 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar12) {
    local_2f0 = *puVar12;
    lStack_2e8 = plVar7[3];
    local_300 = &local_2f0;
  }
  else {
    local_2f0 = *puVar12;
    local_300 = (ulong *)*plVar7;
  }
  local_2f8 = plVar7[1];
  *plVar7 = (long)puVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
  std::ostream::operator<<(local_1b8,this->m_samples);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  std::ios_base::~ios_base(local_148);
  uVar14 = 0xf;
  if (local_300 != &local_2f0) {
    uVar14 = local_2f0;
  }
  if (uVar14 < (ulong)(local_280 + local_2f8)) {
    uVar14 = 0xf;
    if (local_288 != local_278) {
      uVar14 = local_278[0];
    }
    if ((ulong)(local_280 + local_2f8) <= uVar14) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_288,0,(char *)0x0,(ulong)local_300);
      goto LAB_01518dba;
    }
  }
  puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_300,(ulong)local_288);
LAB_01518dba:
  local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  psVar1 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_320.field_2._M_allocated_capacity = *psVar1;
    local_320.field_2._8_8_ = puVar8[3];
  }
  else {
    local_320.field_2._M_allocated_capacity = *psVar1;
    local_320._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_320._M_string_length = puVar8[1];
  *puVar8 = psVar1;
  puVar8[1] = 0;
  *(undefined1 *)psVar1 = 0;
  tcu::ScopedLogSection::ScopedLogSection(&local_2c0,log,&local_340,&local_320);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  if (local_288 != local_278) {
    operator_delete(local_288,local_278[0] + 1);
  }
  if (local_300 != &local_2f0) {
    operator_delete(local_300,local_2f0 + 1);
  }
  if (local_238 != &local_228) {
    operator_delete(local_238,local_228 + 1);
  }
  if (local_1f8[0] != local_1e8) {
    operator_delete(local_1f8[0],local_1e8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
  }
  if (local_268 != local_258) {
    operator_delete(local_268,local_258[0] + 1);
  }
  if (local_2e0 != &local_2d0) {
    operator_delete(local_2e0,local_2d0 + 1);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218,local_208 + 1);
  }
  uVar14 = local_248;
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0],local_1c8[0] + 1);
  }
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar15 = CONCAT44(extraout_var,iVar5);
  (**(code **)(lVar15 + 0xb8))(0x9100,this->m_texID);
  (**(code **)(lVar15 + 0xd8))(this->m_vaoID);
  (**(code **)(lVar15 + 0x40))(0x8892,this->m_vboID);
  (**(code **)(lVar15 + 0x150))
            (0x8892,0x40,
             Functional::(anonymous_namespace)::SamplePosRasterizationTest::
             drawSample(tcu::Surface&,int)::fullscreenQuad,0x88e4);
  dVar6 = (**(code **)(lVar15 + 0x800))();
  glu::checkError(dVar6,"bufferData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x1ee);
  (**(code **)(lVar15 + 0x1a00))(0,0,this->m_canvasSize);
  (**(code **)(lVar15 + 0x1c0))();
  (**(code **)(lVar15 + 0x188))(0x4000);
  (**(code **)(lVar15 + 0x19f0))(this->m_samplerProgramPosLoc,4,0x1406,0,0,0);
  (**(code **)(lVar15 + 0x610))(this->m_samplerProgramPosLoc);
  dVar6 = (**(code **)(lVar15 + 0x800))();
  glu::checkError(dVar6,"vertexAttribPointer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x1f5);
  (**(code **)(lVar15 + 0x1680))((this->m_samplerProgram->m_program).m_program);
  (**(code **)(lVar15 + 0x14f0))(this->m_samplerProgramSamplerLoc,0);
  (**(code **)(lVar15 + 0x14f0))(this->m_samplerProgramSampleNdxLoc,uVar14 & 0xffffffff);
  dVar6 = (**(code **)(lVar15 + 0x800))();
  glu::checkError(dVar6,"useprogram",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x1fa);
  local_1b8 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&fStack_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&fStack_1b0,"Reading from texture with sample index ",0x27);
  std::ostream::operator<<((ostringstream *)&fStack_1b0,(int)uVar14);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fStack_1b0);
  std::ios_base::~ios_base(local_140);
  (**(code **)(lVar15 + 0x538))(5,0,4);
  dVar6 = (**(code **)(lVar15 + 0x800))();
  glu::checkError(dVar6,"drawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x1ff);
  (**(code **)(lVar15 + 0x518))(this->m_samplerProgramPosLoc);
  (**(code **)(lVar15 + 0x1680))(0);
  dVar6 = (**(code **)(lVar15 + 0x800))();
  glu::checkError(dVar6,"cleanup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x203);
  (**(code **)(lVar15 + 0x648))();
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  local_340._M_dataplus._M_p = (pointer)0x300000008;
  if ((void *)local_2a0.m_pixels.m_cap != (void *)0x0) {
    local_2a0.m_pixels.m_cap = (size_t)local_2a0.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b8,(TextureFormat *)&local_340,local_2a0.m_width,
             local_2a0.m_height,1,(void *)local_2a0.m_pixels.m_cap);
  glu::readPixels(context,0,0,(PixelBufferAccess *)local_1b8);
  dVar6 = (**(code **)(lVar15 + 0x800))();
  glu::checkError(dVar6,"readPixels",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x207);
  tcu::TestLog::endSection(local_2c0.m_log);
  pTVar9 = (this->m_testTriangles).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_testTriangles).
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar9) >> 4) *
          -0x55555555) {
    uVar3 = *(undefined8 *)
             (this->m_samplePositions).
             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar14].m_data;
    auVar18._0_4_ = (float)uVar3 + -0.5;
    auVar18._4_4_ = (float)((ulong)uVar3 >> 0x20) + -0.5;
    auVar18._8_8_ = 0;
    auVar19._4_4_ = (float)this->m_canvasSize;
    auVar19._0_4_ = (float)this->m_canvasSize;
    auVar19._8_4_ = 0x3f800000;
    auVar19._12_4_ = 0x3f800000;
    auVar19 = divps(auVar18,auVar19);
    fStack_240 = auVar19._8_4_ + auVar19._8_4_;
    fStack_23c = auVar19._12_4_ + auVar19._12_4_;
    local_248 = CONCAT44(auVar19._4_4_ + auVar19._4_4_,auVar19._0_4_ + auVar19._0_4_);
    lVar15 = 0x20;
    lVar16 = 0;
    do {
      local_188[8] = 0.0;
      local_188[9] = 0.0;
      local_188[10] = 0.0;
      local_188[0xb] = 0.0;
      local_188[4] = 0.0;
      local_188[5] = 0.0;
      local_188[6] = 0.0;
      local_188[7] = 0.0;
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      local_188[3] = 0.0;
      pfVar2 = (float *)((long)(&pTVar9->p1 + -2) + lVar15);
      local_1b8._4_4_ = pfVar2[1] - local_248._4_4_;
      local_1b8._0_4_ = *pfVar2 - (float)local_248;
      _fStack_1b0 = (_func_int **)CONCAT44(pfVar2[3] - fStack_23c,pfVar2[2] - fStack_240);
      pfVar2 = (float *)((long)(&pTVar9->p1 + -1) + lVar15);
      fStack_1a4 = pfVar2[1] - local_248._4_4_;
      local_1a8 = *pfVar2 - (float)local_248;
      fStack_19c = pfVar2[3] - fStack_23c;
      fStack_1a0 = pfVar2[2] - fStack_240;
      pfVar2 = (float *)((long)(pTVar9->p1).m_data + lVar15);
      _local_198 = (void *)CONCAT44(pfVar2[1] - local_248._4_4_,*pfVar2 - (float)local_248);
      fStack_18c = pfVar2[3] - fStack_23c;
      fStack_190 = pfVar2[2] - fStack_240;
      local_158[0] = false;
      local_158[1] = false;
      local_158[2] = false;
      std::
      vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ::push_back(&local_2b8,(value_type *)local_1b8);
      lVar16 = lVar16 + 1;
      pTVar9 = (this->m_testTriangles).
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar15 = lVar15 + 0x30;
    } while (lVar16 < (int)((ulong)((long)(this->m_testTriangles).
                                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar9)
                           >> 4) * -0x55555555);
  }
  pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
  _fStack_1b0 = (_func_int **)CONCAT44(fStack_1ac,(pRVar10->m_pixelFormat).redBits);
  pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
  _fStack_1b0 = (_func_int **)CONCAT44((pRVar10->m_pixelFormat).greenBits,fStack_1b0);
  pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
  local_1a8 = (float)(pRVar10->m_pixelFormat).blueBits;
  local_1b8 = (undefined1  [8])((ulong)(uint)this->m_subpixelBits << 0x20);
  bVar4 = tcu::verifyTriangleGroupRasterization
                    (&local_2a0,(TriangleSceneSpec *)&local_2b8,(RasterizationArguments *)local_1b8,
                     ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                     VERIFICATIONMODE_STRICT);
  if (local_2b8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2b8.
                    super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2b8.
                          super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b8.
                          super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  tcu::Surface::~Surface(&local_2a0);
  bVar4 = (bool)(bVar4 & this->m_allIterationsOk);
  this->m_allIterationsOk = bVar4;
  iVar5 = this->m_iteration + 1;
  this->m_iteration = iVar5;
  IVar17 = CONTINUE;
  if (this->m_samples <= iVar5) {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (bVar4 == false) {
      tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_FAIL,"Pixel comparison failed");
      IVar17 = STOP;
    }
    else {
      IVar17 = STOP;
      tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,"Pass");
    }
  }
  return IVar17;
}

Assistant:

SamplePosRasterizationTest::IterateResult SamplePosRasterizationTest::iterate (void)
{
	m_allIterationsOk &= testMultisampleTexture(m_iteration);
	m_iteration++;

	if (m_iteration < m_samples)
		return CONTINUE;

	// End result
	if (m_allIterationsOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Pixel comparison failed");

	return STOP;
}